

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# System.c
# Opt level: O1

int kwsysSystem_Shell__GetArgumentSize(char *in,int isUnix,int flags)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  size_t sVar4;
  byte *c;
  int iVar5;
  int iVar6;
  uint local_34;
  
  sVar4 = strlen(in);
  iVar5 = (int)sVar4 + 1;
  if (*in == '\0') {
    iVar6 = 0;
  }
  else {
    iVar6 = 0;
    c = (byte *)in;
    do {
      if (((flags & 0x40U) != 0) &&
         (c = (byte *)kwsysSystem_Shell__SkipMakeVariables((char *)c), *c == 0)) break;
      if (isUnix == 0) {
        if ((flags & 4U) == 0) {
          if (*c == 0x22) {
            iVar5 = iVar5 + iVar6 + 1;
          }
          else if (*c == 0x5c) {
            iVar6 = iVar6 + 1;
            goto LAB_003f1683;
          }
          iVar6 = 0;
        }
      }
      else if ((*c - 0x22 < 0x3f) && ((0x4400000000000005U >> ((ulong)(*c - 0x22) & 0x3f) & 1) != 0)
              ) {
        iVar5 = iVar5 + 1;
      }
LAB_003f1683:
      bVar2 = *c;
      if (bVar2 < 0x25) {
        if (bVar2 == 0x23) {
          local_34 = (uint)((~flags & 9U) == 0);
          iVar5 = iVar5 + local_34;
        }
        else if (bVar2 == 0x24) {
          if ((flags & 1U) == 0) goto LAB_003f16a9;
          iVar5 = iVar5 + 1;
        }
      }
      else if (bVar2 == 0x25) {
        iVar5 = iVar5 + (uint)(byte)((flags & 0x30U) != 0 & (byte)flags | (byte)((flags & 2U) >> 1))
        ;
      }
      else if (bVar2 == 0x3b) {
LAB_003f16a9:
        iVar5 = iVar5 + (flags & 2U);
      }
      pbVar1 = c + 1;
      c = c + 1;
    } while (*pbVar1 != 0);
  }
  iVar3 = kwsysSystem_Shell__ArgumentNeedsQuotes(in,isUnix,flags);
  if (iVar3 != 0) {
    iVar3 = iVar5 + 2;
    if (-1 < (char)(byte)flags) {
      iVar3 = iVar5;
    }
    if (isUnix == 0) {
      iVar3 = iVar5;
    }
    iVar5 = iVar3 + iVar6 + 2;
  }
  return iVar5;
}

Assistant:

static int kwsysSystem_Shell__GetArgumentSize(const char* in,
                                              int isUnix, int flags)
{
  /* Start with the length of the original argument, plus one for
     either a terminating null or a separating space.  */
  int size = (int)strlen(in) + 1;

  /* String iterator.  */
  const char* c;

  /* Keep track of how many backslashes have been encountered in a row.  */
  int windows_backslashes = 0;

  /* Scan the string for characters that require escaping or quoting.  */
  for(c=in; *c; ++c)
    {
    /* Look for $(MAKEVAR) syntax if requested.  */
    if(flags & kwsysSystem_Shell_Flag_AllowMakeVariables)
      {
      /* Skip over the make variable references if any are present.  */
      c = kwsysSystem_Shell__SkipMakeVariables(c);

      /* Stop if we have reached the end of the string.  */
      if(!*c)
        {
        break;
        }
      }

    /* Check whether this character needs escaping for the shell.  */
    if(isUnix)
      {
      /* On Unix a few special characters need escaping even inside a
         quoted argument.  */
      if(*c == '\\' || *c == '"' || *c == '`' || *c == '$')
        {
        /* This character needs a backslash to escape it.  */
        ++size;
        }
      }
    else if(flags & kwsysSystem_Shell_Flag_EchoWindows)
      {
      /* On Windows the built-in command shell echo never needs escaping.  */
      }
    else
      {
      /* On Windows only backslashes and double-quotes need escaping.  */
      if(*c == '\\')
        {
        /* Found a backslash.  It may need to be escaped later.  */
        ++windows_backslashes;
        }
      else if(*c == '"')
        {
        /* Found a double-quote.  We need to escape it and all
           immediately preceding backslashes.  */
        size += windows_backslashes + 1;
        windows_backslashes = 0;
        }
      else
        {
        /* Found another character.  This eliminates the possibility
           that any immediately preceding backslashes will be
           escaped.  */
        windows_backslashes = 0;
        }
      }

    /* Check whether this character needs escaping for a make tool.  */
    if(*c == '$')
      {
      if(flags & kwsysSystem_Shell_Flag_Make)
        {
        /* In Makefiles a dollar is written $$ so we need one extra
           character.  */
        ++size;
        }
      else if(flags & kwsysSystem_Shell_Flag_VSIDE)
        {
        /* In a VS IDE a dollar is written "$" so we need two extra
           characters.  */
        size += 2;
        }
      }
    else if(*c == '#')
      {
      if((flags & kwsysSystem_Shell_Flag_Make) &&
         (flags & kwsysSystem_Shell_Flag_WatcomWMake))
        {
        /* In Watcom WMake makefiles a pound is written $# so we need
           one extra character.  */
        ++size;
        }
      }
    else if(*c == '%')
      {
      if((flags & kwsysSystem_Shell_Flag_VSIDE) ||
         ((flags & kwsysSystem_Shell_Flag_Make) &&
          ((flags & kwsysSystem_Shell_Flag_MinGWMake) ||
           (flags & kwsysSystem_Shell_Flag_NMake))))
        {
        /* In the VS IDE, NMake, or MinGW make a percent is written %%
           so we need one extra characters.  */
        size += 1;
        }
      }
    else if(*c == ';')
      {
      if(flags & kwsysSystem_Shell_Flag_VSIDE)
        {
        /* In a VS IDE a semicolon is written ";" so we need two extra
           characters.  */
        size += 2;
        }
      }
    }

  /* Check whether the argument needs surrounding quotes.  */
  if(kwsysSystem_Shell__ArgumentNeedsQuotes(in, isUnix, flags))
    {
    /* Surrounding quotes are needed.  Allocate space for them.  */
    if((flags & kwsysSystem_Shell_Flag_WatcomQuote) && (isUnix))
      {
        size += 2;
      }
    size += 2;

    /* We must escape all ending backslashes when quoting on windows.  */
    size += windows_backslashes;
    }

  return size;
}